

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O0

xmlXIncludeCtxtPtr xmlXIncludeNewContext(xmlDocPtr doc)

{
  xmlXIncludeCtxtPtr ret;
  xmlDocPtr doc_local;
  
  if (doc == (xmlDocPtr)0x0) {
    doc_local = (xmlDocPtr)0x0;
  }
  else {
    doc_local = (xmlDocPtr)(*xmlMalloc)(0x68);
    if (doc_local == (xmlDocPtr)0x0) {
      xmlXIncludeErrMemory((xmlXIncludeCtxtPtr)0x0,(xmlNodePtr)doc,"creating XInclude context");
      doc_local = (xmlDocPtr)0x0;
    }
    else {
      memset(doc_local,0,0x68);
      doc_local->_private = doc;
      doc_local->type = 0;
      *(undefined4 *)&doc_local->field_0xc = 0;
      doc_local->name = (char *)0x0;
      *(undefined4 *)&doc_local->prev = 0;
    }
  }
  return (xmlXIncludeCtxtPtr)doc_local;
}

Assistant:

xmlXIncludeCtxtPtr
xmlXIncludeNewContext(xmlDocPtr doc) {
    xmlXIncludeCtxtPtr ret;

#ifdef DEBUG_XINCLUDE
    xmlGenericError(xmlGenericErrorContext, "New context\n");
#endif
    if (doc == NULL)
	return(NULL);
    ret = (xmlXIncludeCtxtPtr) xmlMalloc(sizeof(xmlXIncludeCtxt));
    if (ret == NULL) {
	xmlXIncludeErrMemory(NULL, (xmlNodePtr) doc,
	                     "creating XInclude context");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlXIncludeCtxt));
    ret->doc = doc;
    ret->incNr = 0;
    ret->incMax = 0;
    ret->incTab = NULL;
    ret->nbErrors = 0;
    return(ret);
}